

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O2

int32_t uprv_compareInvEbcdic_63
                  (UDataSwapper *ds,char *outString,int32_t outLength,UChar *localString,
                  int32_t localLength)

{
  byte bVar1;
  UChar UVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  sVar5 = (size_t)(uint)outLength;
  iVar4 = 0;
  if ((-2 < localLength && -2 < outLength) &&
      (localString != (UChar *)0x0 && outString != (char *)0x0)) {
    if (outLength < 0) {
      sVar5 = strlen(outString);
    }
    if (localLength < 0) {
      localLength = u_strlen_63(localString);
    }
    uVar7 = (ulong)(uint)localLength;
    if ((int)sVar5 < localLength) {
      uVar7 = sVar5 & 0xffffffff;
    }
    lVar6 = 0;
    do {
      if ((int)uVar7 < 1) {
        return (int)sVar5 - localLength;
      }
      if ((ulong)(byte)outString[lVar6] == 0) {
        uVar3 = 0;
      }
      else {
        bVar1 = ""[(byte)outString[lVar6]];
        uVar3 = (uint)bVar1;
        if ((bVar1 == 0) || ((invariantChars[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0)) {
          uVar3 = 0xffffffff;
        }
      }
      UVar2 = localString[lVar6];
      uVar8 = (uint)(ushort)UVar2;
      if ((0x7f < (ushort)UVar2) ||
         ((invariantChars[(ushort)UVar2 >> 5] >> ((ushort)UVar2 & 0x1f) & 1) == 0)) {
        uVar8 = 0xfffffffe;
      }
      uVar7 = (ulong)((int)uVar7 - 1);
      lVar6 = lVar6 + 1;
      iVar4 = uVar3 - uVar8;
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

U_CFUNC int32_t
uprv_compareInvEbcdic(const UDataSwapper *ds,
                      const char *outString, int32_t outLength,
                      const UChar *localString, int32_t localLength) {
    (void)ds;
    int32_t minLength;
    UChar32 c1, c2;
    uint8_t c;

    if(outString==NULL || outLength<-1 || localString==NULL || localLength<-1) {
        return 0;
    }

    if(outLength<0) {
        outLength=(int32_t)uprv_strlen(outString);
    }
    if(localLength<0) {
        localLength=u_strlen(localString);
    }

    minLength= outLength<localLength ? outLength : localLength;

    while(minLength>0) {
        c=(uint8_t)*outString++;
        if(c==0) {
            c1=0;
        } else if((c1=asciiFromEbcdic[c])!=0 && UCHAR_IS_INVARIANT(c1)) {
            /* c1 is set */
        } else {
            c1=-1;
        }

        c2=*localString++;
        if(!UCHAR_IS_INVARIANT(c2)) {
            c2=-2;
        }

        if((c1-=c2)!=0) {
            return c1;
        }

        --minLength;
    }

    /* strings start with same prefix, compare lengths */
    return outLength-localLength;
}